

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_key.cpp
# Opt level: O2

void __thiscall jbcoin::openssl::ec_key::ec_key(ec_key *this,ec_key *that)

{
  EC_KEY *eckey;
  
  if ((EC_KEY *)that->ptr == (EC_KEY *)0x0) {
    this->ptr = (pointer_t)0x0;
    return;
  }
  eckey = EC_KEY_dup((EC_KEY *)that->ptr);
  this->ptr = (pointer_t)eckey;
  if (eckey != (EC_KEY *)0x0) {
    EC_KEY_set_conv_form(eckey,POINT_CONVERSION_COMPRESSED);
    return;
  }
  Throw<std::runtime_error,char_const(&)[37]>((char (*) [37])"ec_key::ec_key() : EC_KEY_dup failed")
  ;
}

Assistant:

ec_key::ec_key (const ec_key& that)
{
    if (that.ptr == nullptr)
    {
        ptr = nullptr;
        return;
    }

    ptr = (pointer_t) EC_KEY_dup (get_EC_KEY (that));

    if (ptr == nullptr)
        Throw<std::runtime_error> ("ec_key::ec_key() : EC_KEY_dup failed");

    EC_KEY_set_conv_form (get_EC_KEY (*this), POINT_CONVERSION_COMPRESSED);
}